

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalBGValueFunctionVector.h
# Opt level: O1

double __thiscall
LocalBGValueFunctionVector::GetValue
          (LocalBGValueFunctionVector *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indPols)

{
  pointer pdVar1;
  Index IVar2;
  
  IVar2 = IndexTools::IndividualToJointIndices(indPols,&this->_m_nrIndivPols);
  pdVar1 = (this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)IVar2 <
      (ulong)((long)(this->_m_values).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pdVar1 >> 3)) {
    return pdVar1[IVar2];
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

double GetValue(std::vector<Index> indPols) const
        { return _m_values.at(
            IndexTools::IndividualToJointIndices(indPols, _m_nrIndivPols)
                ) ;}